

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

size_t __thiscall
google::protobuf::Message::ComputeUnknownFieldsSize
          (Message *this,size_t total_size,CachedSize *cached_size)

{
  int desired;
  UnknownFieldSet *unknown_fields;
  size_t sVar1;
  CachedSize *cached_size_local;
  size_t total_size_local;
  Message *this_local;
  
  unknown_fields =
       internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                 (&(this->super_MessageLite)._internal_metadata_,UnknownFieldSet::default_instance);
  sVar1 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  desired = internal::ToCachedSize(sVar1 + total_size);
  internal::CachedSize::Set(cached_size,desired);
  return sVar1 + total_size;
}

Assistant:

size_t Message::ComputeUnknownFieldsSize(
    size_t total_size, const internal::CachedSize* cached_size) const {
  total_size += WireFormat::ComputeUnknownFieldsSize(
      _internal_metadata_.unknown_fields<UnknownFieldSet>(
          UnknownFieldSet::default_instance));
  cached_size->Set(internal::ToCachedSize(total_size));
  return total_size;
}